

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

CharIterator * __thiscall
absl::Cord::FindImpl
          (CharIterator *__return_storage_ptr__,Cord *this,CharIterator it,string_view needle)

{
  size_t sVar1;
  Cord *pCVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  string_view needle_00;
  ChunkIterator in_stack_fffffffffffffe38;
  undefined8 local_d0 [19];
  size_type local_38;
  size_type idx;
  string_view haystack_chunk;
  Cord *this_local;
  string_view needle_local;
  
  needle_local._M_len = (size_t)needle._M_str;
  this_local = (Cord *)needle._M_len;
  bVar9 = 0;
  haystack_chunk._M_str = (char *)this;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!needle.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d1,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  sVar1 = it.chunk_iterator_.bytes_remaining_;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar1 < sVar4) {
    __assert_fail("it.chunk_iterator_.bytes_remaining_ >= needle.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d3,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  while( true ) {
    sVar1 = it.chunk_iterator_.bytes_remaining_;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar1 < sVar4) break;
    _idx = ChunkRemaining(&it);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&idx);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                    ,0x4dc,
                    "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                   );
    }
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         ((basic_string_view<char,_std::char_traits<char>_> *)&idx,*pvVar5,0);
    if (local_38 == 0xffffffffffffffff) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&idx);
      Advance(&it,sVar4);
    }
    else {
      Advance(&it,local_38);
      sVar1 = it.chunk_iterator_.bytes_remaining_;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      if (sVar1 < sVar4) break;
      memcpy(local_d0,&it,0x98);
      sVar1 = needle_local._M_len;
      pCVar2 = this_local;
      puVar7 = local_d0;
      puVar8 = (undefined8 *)&stack0xfffffffffffffe38;
      for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      needle_00._M_str = (char *)sVar1;
      needle_00._M_len = (size_t)pCVar2;
      bVar3 = anon_unknown_58::IsSubstringInCordAt
                        ((CharIterator)in_stack_fffffffffffffe38,needle_00);
      if (bVar3) {
        memcpy(__return_storage_ptr__,&it,0x98);
        return __return_storage_ptr__;
      }
      Advance(&it,1);
    }
  }
  char_end(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator it,
                                              absl::string_view needle) const {
  // Ensure preconditions are met by callers first.

  // Needle must not be empty.
  assert(!needle.empty());
  // Haystack must be at least as large as needle.
  assert(it.chunk_iterator_.bytes_remaining_ >= needle.size());

  // Cord is a sequence of chunks. To find `needle` we go chunk by chunk looking
  // for the first char of needle, up until we have advanced `N` defined as
  // `haystack.size() - needle.size()`. If we find the first char of needle at
  // `P` and `P` is less than `N`, we then call `IsSubstringInCordAt` to
  // see if this is the needle. If not, we advance to `P + 1` and try again.
  while (it.chunk_iterator_.bytes_remaining_ >= needle.size()) {
    auto haystack_chunk = Cord::ChunkRemaining(it);
    assert(!haystack_chunk.empty());
    // Look for the first char of `needle` in the current chunk.
    auto idx = haystack_chunk.find(needle.front());
    if (idx == absl::string_view::npos) {
      // No potential match in this chunk, advance past it.
      Cord::Advance(&it, haystack_chunk.size());
      continue;
    }
    // We found the start of a potential match in the chunk. Advance the
    // iterator and haystack chunk to the match the position.
    Cord::Advance(&it, idx);
    // Check if there is enough haystack remaining to actually have a match.
    if (it.chunk_iterator_.bytes_remaining_ < needle.size()) {
      break;
    }
    // Check if this is `needle`.
    if (IsSubstringInCordAt(it, needle)) {
      return it;
    }
    // No match, increment the iterator for the next attempt.
    Cord::Advance(&it, 1);
  }
  // If we got here, we did not find `needle`.
  return char_end();
}